

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.h
# Opt level: O0

void __thiscall
Js::AsmJsFunctionTable::AsmJsFunctionTable
          (AsmJsFunctionTable *this,PropertyName name,ArenaAllocator *allocator)

{
  ArenaAllocator *allocator_local;
  PropertyName name_local;
  AsmJsFunctionTable *this_local;
  
  AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
            (&this->super_AsmJsFunctionDeclaration,name,FuncPtrTable,allocator);
  (this->super_AsmJsFunctionDeclaration).super_AsmJsSymbol._vptr_AsmJsSymbol =
       (_func_int **)&PTR_GetType_01df3048;
  JsUtil::List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  List(&this->mTable,allocator,4);
  this->mSize = 0;
  this->field_0x6c = this->field_0x6c & 0xfe;
  this->field_0x6c = this->field_0x6c & 0xfd;
  return;
}

Assistant:

AsmJsFunctionTable( PropertyName name, ArenaAllocator* allocator ) :
            AsmJsFunctionDeclaration( name, symbolType, allocator )
            , mTable(allocator)
            , mSize( 0 )
            , mIsDefined( false )
            , mAreArgumentsKnown( false )
        {

        }